

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

void find_parameter_C(problem *prob,parameter *param,int nr_fold,double start_C,double max_C,
                     double *best_C,double *best_rate)

{
  undefined4 uVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  int iVar5;
  undefined8 uVar6;
  double dVar7;
  undefined8 uVar8;
  int *piVar9;
  double *pdVar10;
  double dVar11;
  feature_node *pfVar12;
  undefined1 auVar13 [16];
  _func_void_char_ptr *p_Var14;
  int iVar15;
  int iVar16;
  uint uVar17;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  void *__s;
  uint *__ptr_02;
  long lVar18;
  void *pvVar19;
  model *model_;
  ulong uVar20;
  ulong uVar21;
  _func_void_char_ptr *p_Var22;
  uint uVar23;
  undefined8 *puVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  size_t __size;
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  parameter local_78;
  
  uVar17 = prob->l;
  uVar27 = (ulong)uVar17;
  lVar25 = (long)(int)uVar17;
  __ptr = malloc(lVar25 * 4);
  __ptr_00 = malloc(lVar25 * 8);
  __ptr_01 = malloc((long)nr_fold << 5);
  __s = malloc((long)nr_fold * 8);
  if (0 < nr_fold) {
    memset(__s,0,(ulong)(uint)nr_fold << 3);
  }
  p_Var14 = liblinear_print_string;
  uVar6._0_4_ = param->solver_type;
  uVar6._4_4_ = *(undefined4 *)&param->field_0x4;
  dVar7 = param->eps;
  uVar8._0_4_ = param->nr_thread;
  uVar8._4_4_ = param->nr_weight;
  piVar9 = param->weight_label;
  pdVar10 = param->weight;
  dVar11 = param->p;
  uVar28 = (ulong)(uint)nr_fold;
  if ((int)uVar17 < nr_fold) {
    find_parameter_C_cold_1();
    uVar28 = uVar27;
  }
  iVar5 = (int)uVar28;
  uVar23 = iVar5 + 1;
  __ptr_02 = (uint *)malloc((long)(int)uVar23 << 2);
  auVar13 = _DAT_0010c0c0;
  if (0 < (int)uVar17) {
    lVar29 = uVar27 - 1;
    auVar31._8_4_ = (int)lVar29;
    auVar31._0_8_ = lVar29;
    auVar31._12_4_ = (int)((ulong)lVar29 >> 0x20);
    uVar20 = 0;
    auVar31 = auVar31 ^ _DAT_0010c0c0;
    auVar36 = _DAT_0010c0b0;
    do {
      auVar35 = auVar36 ^ auVar13;
      if ((bool)(~(auVar31._4_4_ < auVar35._4_4_ ||
                  auVar31._0_4_ < auVar35._0_4_ && auVar35._4_4_ == auVar31._4_4_) & 1)) {
        *(int *)((long)__ptr + uVar20 * 4) = (int)uVar20;
      }
      if (auVar35._12_4_ <= auVar31._12_4_ &&
          (auVar35._8_4_ <= auVar31._8_4_ || auVar35._12_4_ != auVar31._12_4_)) {
        *(int *)((long)__ptr + uVar20 * 4 + 4) = (int)uVar20 + 1;
      }
      uVar20 = uVar20 + 2;
      lVar29 = auVar36._8_8_;
      auVar36._0_8_ = auVar36._0_8_ + 2;
      auVar36._8_8_ = lVar29 + 2;
    } while ((uVar17 + 1 & 0xfffffffe) != uVar20);
    if (0 < (int)uVar17) {
      lVar29 = 0;
      do {
        iVar15 = rand();
        lVar18 = iVar15 % (int)uVar27 + lVar29;
        uVar1 = *(undefined4 *)((long)__ptr + lVar29 * 4);
        *(undefined4 *)((long)__ptr + lVar29 * 4) = *(undefined4 *)((long)__ptr + lVar18 * 4);
        *(undefined4 *)((long)__ptr + lVar18 * 4) = uVar1;
        lVar29 = lVar29 + 1;
        uVar27 = uVar27 - 1;
      } while (uVar27 != 0);
    }
  }
  auVar13 = _DAT_0010c0c0;
  if (-1 < iVar5) {
    lVar29 = (ulong)uVar23 - 1;
    auVar32._8_4_ = (int)lVar29;
    auVar32._0_8_ = lVar29;
    auVar32._12_4_ = (int)((ulong)lVar29 >> 0x20);
    iVar15 = 0;
    auVar32 = auVar32 ^ _DAT_0010c0c0;
    uVar27 = 0;
    auVar35 = _DAT_0010c0b0;
    do {
      auVar36 = auVar35 ^ auVar13;
      if ((bool)(~(auVar36._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar36._0_4_ ||
                  auVar32._4_4_ < auVar36._4_4_) & 1)) {
        *(int *)((long)__ptr_02 + uVar27) = iVar15 / iVar5;
      }
      if ((auVar36._12_4_ != auVar32._12_4_ || auVar36._8_4_ <= auVar32._8_4_) &&
          auVar36._12_4_ <= auVar32._12_4_) {
        *(int *)((long)__ptr_02 + uVar27 + 4) = (int)(uVar17 + iVar15) / iVar5;
      }
      lVar29 = auVar35._8_8_;
      auVar35._0_8_ = auVar35._0_8_ + 2;
      auVar35._8_8_ = lVar29 + 2;
      uVar27 = uVar27 + 8;
      iVar15 = iVar15 + uVar17 * 2;
    } while (((ulong)uVar23 * 4 + 4 & 0xfffffffffffffff8) != uVar27);
    iVar15 = prob->n;
    uVar27 = 0;
    uVar23 = *__ptr_02;
    do {
      uVar20 = (ulong)uVar23;
      uVar2 = __ptr_02[uVar27 + 1];
      lVar29 = uVar27 * 0x20;
      *(double *)((long)__ptr_01 + lVar29 + 0x18) = prob->bias;
      *(int *)((long)__ptr_01 + lVar29 + 4) = iVar15;
      iVar16 = (uVar23 - uVar2) + uVar17;
      *(int *)((long)__ptr_01 + lVar29) = iVar16;
      __size = (long)iVar16 << 3;
      pvVar19 = malloc(__size);
      *(void **)((long)__ptr_01 + lVar29 + 0x10) = pvVar19;
      pvVar19 = malloc(__size);
      *(void **)((long)__ptr_01 + lVar29 + 8) = pvVar19;
      if ((int)uVar23 < 1) {
        uVar20 = 0;
      }
      else {
        uVar21 = 0;
        do {
          iVar16 = *(int *)((long)__ptr + uVar21 * 4);
          *(feature_node **)(*(long *)((long)__ptr_01 + lVar29 + 0x10) + uVar21 * 8) =
               prob->x[iVar16];
          *(double *)(*(long *)((long)__ptr_01 + lVar29 + 8) + uVar21 * 8) = prob->y[iVar16];
          uVar21 = uVar21 + 1;
        } while (uVar20 != uVar21);
      }
      if ((int)uVar2 < (int)uVar17) {
        lVar18 = (long)(int)uVar2;
        do {
          iVar16 = *(int *)((long)__ptr + lVar18 * 4);
          *(feature_node **)(*(long *)((long)__ptr_01 + lVar29 + 0x10) + uVar20 * 8) =
               prob->x[iVar16];
          *(double *)(*(long *)((long)__ptr_01 + lVar29 + 8) + uVar20 * 8) = prob->y[iVar16];
          uVar20 = uVar20 + 1;
          lVar18 = lVar18 + 1;
        } while (lVar25 != lVar18);
      }
      uVar27 = uVar27 + 1;
      uVar23 = uVar2;
    } while (uVar27 != uVar28);
  }
  *best_rate = 0.0;
  dVar33 = 0.0;
  if (0.0 < start_C) goto LAB_0010906e;
  iVar15 = prob->l;
  if (0 < (long)iVar15) {
    lVar25 = 0;
    dVar30 = 0.0;
    do {
      dVar33 = 0.0;
      iVar16 = prob->x[lVar25]->index;
      pfVar12 = prob->x[lVar25];
      while (iVar16 != -1) {
        dVar33 = dVar33 + pfVar12->value * pfVar12->value;
        iVar16 = pfVar12[1].index;
        pfVar12 = pfVar12 + 1;
      }
      if (dVar33 <= dVar30) {
        dVar33 = dVar30;
      }
      lVar25 = lVar25 + 1;
      dVar30 = dVar33;
    } while (lVar25 != iVar15);
  }
  if (param->solver_type == 2) {
    iVar15 = iVar15 * 2;
LAB_00109040:
    dVar33 = 1.0 / (dVar33 * (double)iVar15);
  }
  else {
    if (param->solver_type == 0) goto LAB_00109040;
    dVar33 = 1.0;
  }
  dVar33 = log(dVar33);
  dVar33 = floor(dVar33 / 0.6931471805599453);
  start_C = exp2(dVar33);
LAB_0010906e:
  p_Var22 = print_string_stdout;
  if (p_Var14 != (_func_void_char_ptr *)0x0) {
    p_Var22 = p_Var14;
  }
  iVar15 = 0;
  dVar33 = start_C;
  do {
    dVar30 = dVar33;
    if (max_C < dVar30) break;
    liblinear_print_string = print_null;
    if (-1 < iVar5) {
      uVar27 = 0;
      uVar17 = *__ptr_02;
      do {
        uVar23 = __ptr_02[uVar27 + 1];
        pdVar3 = *(double **)((long)__s + uVar27 * 8);
        local_78._0_8_ = uVar6;
        local_78.eps = dVar7;
        local_78.C = dVar30;
        local_78._24_8_ = uVar8;
        local_78.weight_label = piVar9;
        local_78.weight = pdVar10;
        local_78.p = dVar11;
        local_78.init_sol = pdVar3;
        model_ = train((problem *)((long)__ptr_01 + uVar27 * 0x20),&local_78);
        iVar16 = model_->nr_class;
        if (iVar16 == 2) {
          iVar16 = 1;
        }
        uVar20 = (long)iVar16 * (long)*(int *)((long)__ptr_01 + uVar27 * 0x20 + 4);
        iVar16 = (int)uVar20;
        if (pdVar3 == (double *)0x0) {
          pvVar19 = malloc(uVar20 * 8);
          *(void **)((long)__s + uVar27 * 8) = pvVar19;
          if (0 < iVar16) {
            pdVar3 = model_->w;
            uVar21 = 0;
            do {
              *(double *)((long)pvVar19 + uVar21 * 8) = pdVar3[uVar21];
              uVar21 = uVar21 + 1;
            } while ((uVar20 & 0xffffffff) != uVar21);
          }
        }
        else if (iVar15 < 0) {
          if (0 < iVar16) {
            pdVar4 = model_->w;
            uVar21 = 0;
            do {
              pdVar3[uVar21] = pdVar4[uVar21];
              uVar21 = uVar21 + 1;
            } while ((uVar20 & 0xffffffff) != uVar21);
          }
        }
        else {
          if (iVar16 < 1) {
            dVar33 = 0.0;
          }
          else {
            pdVar4 = model_->w;
            dVar33 = 0.0;
            uVar21 = 0;
            do {
              dVar34 = pdVar4[uVar21] - pdVar3[uVar21];
              dVar33 = dVar33 + dVar34 * dVar34;
              pdVar3[uVar21] = pdVar4[uVar21];
              uVar21 = uVar21 + 1;
            } while ((uVar20 & 0xffffffff) != uVar21);
          }
          if (dVar33 < 0.0) {
            dVar33 = sqrt(dVar33);
          }
          else {
            dVar33 = SQRT(dVar33);
          }
          if (1e-15 < dVar33) {
            iVar15 = -1;
          }
        }
        if ((int)uVar17 < (int)uVar23) {
          lVar25 = 0;
          do {
            lVar29 = (long)*(int *)((long)__ptr + lVar25 * 4 + (long)(int)uVar17 * 4);
            dVar33 = predict(model_,prob->x[lVar29]);
            *(double *)((long)__ptr_00 + lVar29 * 8) = dVar33;
            lVar25 = lVar25 + 1;
          } while (uVar23 - uVar17 != (int)lVar25);
        }
        if (model_ != (model *)0x0) {
          free_model_content(model_);
          free(model_);
        }
        uVar27 = uVar27 + 1;
        uVar17 = uVar23;
      } while (uVar27 != uVar28);
    }
    iVar16 = prob->l;
    if ((long)iVar16 < 1) {
      dVar33 = 0.0;
    }
    else {
      lVar25 = 0;
      iVar26 = 0;
      do {
        iVar26 = iVar26 + (uint)(prob->y[lVar25] == *(double *)((long)__ptr_00 + lVar25 * 8));
        lVar25 = lVar25 + 1;
      } while (iVar16 != lVar25);
      dVar33 = (double)iVar26;
    }
    dVar33 = dVar33 / (double)iVar16;
    liblinear_print_string = p_Var22;
    if (*best_rate <= dVar33 && dVar33 != *best_rate) {
      *best_C = dVar30;
      *best_rate = dVar33;
    }
    dVar34 = log(dVar30);
    info("log2c=%7.2f\trate=%g\n",dVar34 / 0.6931471805599453,dVar33 * 100.0);
    iVar15 = iVar15 + 1;
    dVar33 = dVar30 + dVar30;
  } while (iVar15 != 3);
  if ((start_C < max_C) && (max_C < dVar30)) {
    info("warning: maximum C reached.\n");
  }
  free(__ptr_02);
  free(__ptr);
  free(__ptr_00);
  if (-1 < iVar5) {
    puVar24 = (undefined8 *)((long)__ptr_01 + 0x10);
    uVar27 = 0;
    do {
      free((void *)*puVar24);
      free((void *)puVar24[-1]);
      free(*(void **)((long)__s + uVar27 * 8));
      uVar27 = uVar27 + 1;
      puVar24 = puVar24 + 4;
    } while (uVar28 != uVar27);
  }
  free(__s);
  free(__ptr_01);
  return;
}

Assistant:

void find_parameter_C(const problem *prob, const parameter *param, int nr_fold, double start_C, double max_C, double *best_C, double *best_rate)
{
	// variables for CV
	int i;
	int *fold_start;
	int l = prob->l;
	int *perm = Malloc(int, l);
	double *target = Malloc(double, prob->l);
	struct problem *subprob = Malloc(problem,nr_fold);

	// variables for warm start
	double ratio = 2;
	double **prev_w = Malloc(double*, nr_fold);
	for(i = 0; i < nr_fold; i++)
		prev_w[i] = NULL;
	int num_unchanged_w = 0;
	struct parameter param1 = *param;
	void (*default_print_string) (const char *) = liblinear_print_string;

	if (nr_fold > l)
	{
		nr_fold = l;
		fprintf(stderr,"WARNING: # folds > # data. Will use # folds = # data instead (i.e., leave-one-out cross validation)\n");
	}
	fold_start = Malloc(int,nr_fold+1);
	for(i=0;i<l;i++) perm[i]=i;
	for(i=0;i<l;i++)
	{
		int j = i+rand()%(l-i);
		swap(perm[i],perm[j]);
	}
	for(i=0;i<=nr_fold;i++)
		fold_start[i]=i*l/nr_fold;

	for(i=0;i<nr_fold;i++)
	{
		int begin = fold_start[i];
		int end = fold_start[i+1];
		int j,k;

		subprob[i].bias = prob->bias;
		subprob[i].n = prob->n;
		subprob[i].l = l-(end-begin);
		subprob[i].x = Malloc(struct feature_node*,subprob[i].l);
		subprob[i].y = Malloc(double,subprob[i].l);

		k=0;
		for(j=0;j<begin;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}
		for(j=end;j<l;j++)
		{
			subprob[i].x[k] = prob->x[perm[j]];
			subprob[i].y[k] = prob->y[perm[j]];
			++k;
		}

	}

	*best_rate = 0;
	if(start_C <= 0)
		start_C = calc_start_C(prob,param);
	param1.C = start_C;

	while(param1.C <= max_C)
	{
		//Output diabled for running CV at a particular C
		set_print_string_function(&print_null);

#ifdef CV_OMP
#pragma omp parallel for private(i) schedule(dynamic)
#endif
		for(i=0; i<nr_fold; i++)
		{
			int j;
			int begin = fold_start[i];
			int end = fold_start[i+1];

			struct parameter param_t = param1;
			param_t.init_sol = prev_w[i];
			struct model *submodel = train(&subprob[i],&param_t);

			int total_w_size;
			if(submodel->nr_class == 2)
				total_w_size = subprob[i].n;
			else
				total_w_size = subprob[i].n * submodel->nr_class;

			if(prev_w[i] == NULL)
			{
				prev_w[i] = Malloc(double, total_w_size);
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}
			else if(num_unchanged_w >= 0)
			{
				double norm_w_diff = 0;
				for(j=0; j<total_w_size; j++)
				{
					norm_w_diff += (submodel->w[j] - prev_w[i][j])*(submodel->w[j] - prev_w[i][j]);
					prev_w[i][j] = submodel->w[j];
				}
				norm_w_diff = sqrt(norm_w_diff);

				if(norm_w_diff > 1e-15)
					num_unchanged_w = -1;
			}
			else
			{
				for(j=0; j<total_w_size; j++)
					prev_w[i][j] = submodel->w[j];
			}

			for(j=begin; j<end; j++)
				target[perm[j]] = predict(submodel,prob->x[perm[j]]);

			free_and_destroy_model(&submodel);
		}
		set_print_string_function(default_print_string);

		int total_correct = 0;
		for(i=0; i<prob->l; i++)
			if(target[i] == prob->y[i])
				++total_correct;
		double current_rate = (double)total_correct/prob->l;
		if(current_rate > *best_rate)
		{
			*best_C = param1.C;
			*best_rate = current_rate;
		}

		info("log2c=%7.2f\trate=%g\n",log(param1.C)/log(2.0),100.0*current_rate);
		num_unchanged_w++;
		if(num_unchanged_w == 3)
			break;
		param1.C = param1.C*ratio;
	}

	if(param1.C > max_C && max_C > start_C) 
		info("warning: maximum C reached.\n");
	free(fold_start);
	free(perm);
	free(target);
	for(i=0; i<nr_fold; i++)
	{
		free(subprob[i].x);
		free(subprob[i].y);
		free(prev_w[i]);
	}
	free(prev_w);
	free(subprob);
}